

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

bytes * hexStringToBytes(bytes *__return_storage_ptr__,string *_s)

{
  pointer *ppuVar1;
  char *pcVar2;
  iterator iVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  undefined8 in_RAX;
  ulong uVar7;
  uint uVar8;
  undefined8 uStack_38;
  
  pcVar2 = (_s->_M_dataplus)._M_p;
  uVar8 = 0;
  if (*pcVar2 == '0') {
    uVar8 = (uint)(pcVar2[1] == 'x') * 2;
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = (ulong)uVar8;
  uStack_38 = in_RAX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(_s->_M_string_length - uVar7) + 1 >> 1);
  if ((_s->_M_string_length & 1) != 0) {
    uVar8 = uVar8 | 1;
    iVar5 = fromHex((_s->_M_dataplus)._M_p[uVar7]);
    uStack_38._0_7_ = CONCAT16((uchar)iVar5,(undefined6)uStack_38);
    iVar3._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar3,(uchar *)((long)&uStack_38 + 6));
    }
    else {
      *iVar3._M_current = (uchar)iVar5;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  uVar7 = (ulong)uVar8;
  if (uVar7 < _s->_M_string_length) {
    uVar8 = uVar8 + 1;
    do {
      iVar5 = fromHex((_s->_M_dataplus)._M_p[uVar7]);
      iVar6 = fromHex((_s->_M_dataplus)._M_p[uVar8]);
      uVar4 = (char)iVar6 + (char)(iVar5 << 4);
      uStack_38._0_6_ = CONCAT15(uVar4,(undefined5)uStack_38);
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (__return_storage_ptr__,iVar3,(uchar *)((long)&uStack_38 + 5));
      }
      else {
        *iVar3._M_current = uVar4;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar7 = (ulong)(uVar8 + 1);
      uVar8 = uVar8 + 2;
    } while (uVar7 < _s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

bytes hexStringToBytes(std::string const& _s)
{
	unsigned s = (_s[0] == '0' && _s[1] == 'x') ? 2 : 0;
	std::vector<uint8_t> ret;
	ret.reserve((_s.size() - s + 1) / 2);

	if (_s.size() % 2)
		try
		{
			ret.push_back(fromHex(_s[s++]));
		}
		catch (...)
		{
			ret.push_back(0);
		}
	for (unsigned i = s; i < _s.size(); i += 2)
		try
		{
			ret.push_back((byte)(fromHex(_s[i]) * 16 + fromHex(_s[i + 1])));
		}
		catch (...){
			ret.push_back(0);
		}
	return ret;
}